

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O2

bool __thiscall FsmMachineClass::operator<(FsmMachineClass *this,FsmMachineClass *fsmc)

{
  ushort uVar1;
  ushort uVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (this != fsmc) {
    puVar3 = (this->m_wGlyphs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(this->m_wGlyphs).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3 >> 1;
    puVar4 = (fsmc->m_wGlyphs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(fsmc->m_wGlyphs).
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4 >> 1;
    if (uVar5 != uVar6) {
      return uVar5 < uVar6;
    }
    uVar6 = 0xffffffffffffffff;
    while (uVar6 - uVar5 != -1) {
      uVar1 = puVar3[uVar6 + 1];
      uVar2 = puVar4[uVar6 + 1];
      uVar6 = uVar6 + 1;
      if (uVar1 != uVar2) {
        return uVar1 < uVar2 && uVar6 < uVar5;
      }
    }
  }
  return false;
}

Assistant:

bool operator<(const FsmMachineClass & fsmc) const
	{
		if (this == &fsmc)
			return false; // equal, not less than
		if (this->m_wGlyphs.size() != fsmc.m_wGlyphs.size())
			return (this->m_wGlyphs.size() < fsmc.m_wGlyphs.size());
		for (size_t iw = 0; iw < m_wGlyphs.size(); iw++)
		{
			if (this->m_wGlyphs[iw] != fsmc.m_wGlyphs[iw])
				return (this->m_wGlyphs[iw] < fsmc.m_wGlyphs[iw]);
		}
		return false; // equal, not less than
	}